

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtw_merge.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  istream *input_stream;
  int iVar10;
  int iVar11;
  int read_size;
  char *pcVar12;
  size_type __n;
  bool bVar13;
  allocator local_825;
  int num_order;
  int local_820;
  int curr_reference_vector_index;
  int curr_query_vector_index;
  int local_814;
  string local_810;
  vector<double,_std::allocator<double>_> reference_vector;
  vector<double,_std::allocator<double>_> query_vector;
  ifstream ifs2;
  byte abStack_7a0 [488];
  ostringstream error_message_6;
  ifstream ifs1;
  byte abStack_420 [488];
  ifstream ifs3;
  byte abStack_218 [488];
  
  num_order = 0x19;
  while( true ) {
    while (iVar7 = ya_getopt_long(argc,argv,"l:m:h",(option *)0x0,(int *)0x0), iVar7 == 0x6c) {
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar13 = sptk::ConvertStringToInteger((string *)&ifs1,&num_order);
      bVar5 = num_order < 1;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar13 || bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        std::operator<<((ostream *)&ifs1,"The argument for the -l option must be a positive integer"
                       );
        std::__cxx11::string::string((string *)&ifs2,"dtw_merge",(allocator *)&ifs3);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_001028ab;
      }
      num_order = num_order + -1;
    }
    if (iVar7 != 0x6d) break;
    std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
    bVar5 = sptk::ConvertStringToInteger((string *)&ifs1,&num_order);
    bVar13 = num_order < 0;
    std::__cxx11::string::~string((string *)&ifs1);
    if (!bVar5 || bVar13) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      poVar8 = std::operator<<((ostream *)&ifs1,"The argument for the -m option must be a ");
      std::operator<<(poVar8,"non-negative integer");
      std::__cxx11::string::string((string *)&ifs2,"dtw_merge",(allocator *)&ifs3);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
LAB_001028ab:
      std::__cxx11::string::~string((string *)&ifs2);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs1);
      return 1;
    }
  }
  if (iVar7 != -1) {
    if (iVar7 != 0x68) {
      anon_unknown.dwarf_2adf::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    anon_unknown.dwarf_2adf::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  lVar9 = (long)argc;
  if (argc - ya_optind == 2) {
    lVar3 = lVar9 + -2;
    lVar4 = lVar9 + -1;
    pcVar12 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      std::operator<<((ostream *)&ifs1,"Three input files are required");
      std::__cxx11::string::string((string *)&ifs2,"dtw_merge",(allocator *)&ifs3);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
      goto LAB_001028ab;
    }
    lVar3 = lVar9 + -3;
    lVar4 = lVar9 + -2;
    pcVar12 = argv[lVar9 + -1];
  }
  pcVar1 = argv[lVar3];
  pcVar2 = argv[lVar4];
  bVar5 = sptk::SetBinaryMode();
  if (!bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
    std::operator<<((ostream *)&ifs1,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&ifs2,"dtw_merge",(allocator *)&ifs3);
    sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
    goto LAB_001028ab;
  }
  std::ifstream::ifstream(&ifs1);
  std::ifstream::open((char *)&ifs1,(_Ios_Openmode)pcVar1);
  if ((abStack_420[*(long *)(_ifs1 + -0x18)] & 5) == 0) {
    std::ifstream::ifstream(&ifs2);
    std::ifstream::open((char *)&ifs2,(_Ios_Openmode)pcVar2);
    if ((abStack_7a0[*(long *)(_ifs2 + -0x18)] & 5) == 0) {
      input_stream = (istream *)&ifs3;
      std::ifstream::ifstream(input_stream);
      if ((pcVar12 == (char *)0x0) ||
         (std::ifstream::open((char *)&ifs3,(_Ios_Openmode)pcVar12),
         (abStack_218[*(long *)(_ifs3 + -0x18)] & 5) == 0)) {
        cVar6 = std::__basic_file<char>::is_open();
        if (cVar6 == '\0') {
          input_stream = (istream *)&std::cin;
        }
        __n = (long)num_order + 1;
        std::vector<double,_std::allocator<double>_>::vector
                  (&query_vector,__n,(allocator_type *)&error_message_6);
        std::vector<double,_std::allocator<double>_>::vector
                  (&reference_vector,__n,(allocator_type *)&error_message_6);
        read_size = (int)__n;
        bVar5 = sptk::ReadStream<double>(false,0,0,read_size,&query_vector,input_stream,(int *)0x0);
        iVar7 = 0;
        if (bVar5) {
          bVar5 = sptk::ReadStream<double>
                            (false,0,0,read_size,&reference_vector,(istream *)&ifs2,(int *)0x0);
          iVar7 = 0;
          if (bVar5) {
            local_814 = 0;
            local_820 = 0;
            iVar10 = 0;
            do {
              bVar5 = sptk::ReadStream<int>(&curr_query_vector_index,(istream *)&ifs1);
              iVar7 = 0;
              if ((!bVar5) ||
                 (bVar5 = sptk::ReadStream<int>(&curr_reference_vector_index,(istream *)&ifs1),
                 iVar7 = iVar10, !bVar5)) goto LAB_00102cc1;
              if ((curr_query_vector_index < 0) ||
                 (((curr_reference_vector_index < 0 ||
                   (iVar11 = curr_query_vector_index - local_814,
                   curr_query_vector_index < local_814)) ||
                  (curr_reference_vector_index < local_820)))) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
                std::operator<<((ostream *)&error_message_6,"Invalid Viterbi path");
                std::__cxx11::string::string((string *)&local_810,"dtw_merge",&local_825);
                sptk::PrintErrorMessage(&local_810,&error_message_6);
                goto LAB_00102ca7;
              }
              if (iVar11 < 1) {
                iVar11 = 0;
              }
              iVar11 = iVar11 + 1;
              while (iVar11 = iVar11 + -1, iVar11 != 0) {
                bVar5 = sptk::ReadStream<double>
                                  (false,0,0,read_size,&query_vector,input_stream,(int *)0x0);
                if (!bVar5) goto LAB_00102cc1;
              }
              local_814 = curr_query_vector_index;
              iVar11 = curr_reference_vector_index - local_820;
              if (iVar11 < 1) {
                iVar11 = 0;
              }
              iVar11 = iVar11 + 1;
              while (iVar11 = iVar11 + -1, iVar11 != 0) {
                bVar5 = sptk::ReadStream<double>
                                  (false,0,0,read_size,&reference_vector,(istream *)&ifs2,(int *)0x0
                                  );
                if (!bVar5) goto LAB_00102cc1;
              }
              local_820 = curr_reference_vector_index;
              bVar5 = sptk::WriteStream<double>
                                (0,read_size,&query_vector,(ostream *)&std::cout,(int *)0x0);
            } while ((bVar5) &&
                    (bVar5 = sptk::WriteStream<double>
                                       (0,read_size,&reference_vector,(ostream *)&std::cout,
                                        (int *)0x0), bVar5));
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
            std::operator<<((ostream *)&error_message_6,"Failed to write merged vector");
            std::__cxx11::string::string((string *)&local_810,"dtw_merge",&local_825);
            sptk::PrintErrorMessage(&local_810,&error_message_6);
LAB_00102ca7:
            std::__cxx11::string::~string((string *)&local_810);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
            iVar7 = 1;
          }
        }
LAB_00102cc1:
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&reference_vector.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&query_vector.super__Vector_base<double,_std::allocator<double>_>);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
        poVar8 = std::operator<<((ostream *)&error_message_6,"Cannot open file ");
        std::operator<<(poVar8,pcVar12);
        std::__cxx11::string::string((string *)&local_810,"dtw_merge",(allocator *)&query_vector);
        sptk::PrintErrorMessage(&local_810,&error_message_6);
        std::__cxx11::string::~string((string *)&local_810);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
        iVar7 = 1;
      }
      std::ifstream::~ifstream(&ifs3);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs3);
      poVar8 = std::operator<<((ostream *)&ifs3,"Cannot open file ");
      std::operator<<(poVar8,pcVar2);
      std::__cxx11::string::string((string *)&error_message_6,"dtw_merge",(allocator *)&local_810);
      sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs3);
      std::__cxx11::string::~string((string *)&error_message_6);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs3);
      iVar7 = 1;
    }
    std::ifstream::~ifstream(&ifs2);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs2);
    poVar8 = std::operator<<((ostream *)&ifs2,"Cannot open file ");
    std::operator<<(poVar8,pcVar1);
    std::__cxx11::string::string((string *)&ifs3,"dtw_merge",(allocator *)&error_message_6);
    sptk::PrintErrorMessage((string *)&ifs3,(ostringstream *)&ifs2);
    std::__cxx11::string::~string((string *)&ifs3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs2);
    iVar7 = 1;
  }
  std::ifstream::~ifstream(&ifs1);
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dtw_merge", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dtw_merge", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* viterbi_path_file;
  const char* reference_file;
  const char* query_file;
  const int num_input_files(argc - optind);
  if (3 == num_input_files) {
    viterbi_path_file = argv[argc - 3];
    reference_file = argv[argc - 2];
    query_file = argv[argc - 1];
  } else if (2 == num_input_files) {
    viterbi_path_file = argv[argc - 2];
    reference_file = argv[argc - 1];
    query_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Three input files are required";
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }

  std::ifstream ifs1;
  ifs1.open(viterbi_path_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << viterbi_path_file;
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }
  std::istream& input_stream_for_path(ifs1);

  std::ifstream ifs2;
  ifs2.open(reference_file, std::ios::in | std::ios::binary);
  if (ifs2.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << reference_file;
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }
  std::istream& input_stream_for_reference(ifs2);

  std::ifstream ifs3;
  if (NULL != query_file) {
    ifs3.open(query_file, std::ios::in | std::ios::binary);
    if (ifs3.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << query_file;
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }
  }
  std::istream& input_stream_for_query(ifs3.is_open() ? ifs3 : std::cin);

  const int length(num_order + 1);
  std::vector<double> query_vector(length);
  std::vector<double> reference_vector(length);
  if (!sptk::ReadStream(false, 0, 0, length, &query_vector,
                        &input_stream_for_query, NULL) ||
      !sptk::ReadStream(false, 0, 0, length, &reference_vector,
                        &input_stream_for_reference, NULL)) {
    return 0;
  }

  int prev_query_vector_index(0), prev_reference_vector_index(0);
  int curr_query_vector_index, curr_reference_vector_index;
  while (
      sptk::ReadStream(&curr_query_vector_index, &input_stream_for_path) &&
      sptk::ReadStream(&curr_reference_vector_index, &input_stream_for_path)) {
    if (curr_query_vector_index < 0 || curr_reference_vector_index < 0 ||
        curr_query_vector_index < prev_query_vector_index ||
        curr_reference_vector_index < prev_reference_vector_index) {
      std::ostringstream error_message;
      error_message << "Invalid Viterbi path";
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }

    {
      const int diff(curr_query_vector_index - prev_query_vector_index);
      for (int i(0); i < diff; ++i) {
        if (!sptk::ReadStream(false, 0, 0, length, &query_vector,
                              &input_stream_for_query, NULL)) {
          return 0;
        }
      }
      prev_query_vector_index = curr_query_vector_index;
    }

    {
      const int diff(curr_reference_vector_index - prev_reference_vector_index);
      for (int i(0); i < diff; ++i) {
        if (!sptk::ReadStream(false, 0, 0, length, &reference_vector,
                              &input_stream_for_reference, NULL)) {
          return 0;
        }
      }
      prev_reference_vector_index = curr_reference_vector_index;
    }

    if (!sptk::WriteStream(0, length, query_vector, &std::cout, NULL) ||
        !sptk::WriteStream(0, length, reference_vector, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write merged vector";
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }
  }

  return 0;
}